

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodel_p.h
# Opt level: O0

CheckState QtPrivate::legacyEnumValueFromModelData<Qt::CheckState>(QVariant *data)

{
  int iVar1;
  int iVar2;
  bool *in_RDI;
  undefined4 local_4;
  
  iVar1 = ::QVariant::userType((QVariant *)0x856737);
  iVar2 = qMetaTypeId<Qt::CheckState>();
  if (iVar1 == iVar2) {
    local_4 = ::QVariant::value<Qt::CheckState>((QVariant *)0x856754);
  }
  else {
    local_4 = ::QVariant::toInt(in_RDI);
  }
  return local_4;
}

Assistant:

T legacyEnumValueFromModelData(const QVariant &data)
{
    static_assert(std::is_enum_v<T>);
    if (data.userType() == qMetaTypeId<T>()) {
        return data.value<T>();
    } else if (std::is_same_v<std::underlying_type_t<T>, int> ||
               std::is_same_v<std::underlying_type_t<T>, uint>) {
        return T(data.toInt());
    }

    return T();
}